

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void __thiscall testing::InSequence::InSequence(InSequence *this)

{
  Sequence **ppSVar1;
  Sequence *this_00;
  Sequence *local_18;
  InSequence *local_10;
  InSequence *this_local;
  
  local_10 = this;
  ppSVar1 = internal::ThreadLocal<testing::Sequence_*>::get
                      ((ThreadLocal<testing::Sequence_*> *)internal::g_gmock_implicit_sequence);
  if (*ppSVar1 == (Sequence *)0x0) {
    this_00 = (Sequence *)operator_new(0x10);
    Sequence::Sequence(this_00);
    local_18 = this_00;
    internal::ThreadLocal<testing::Sequence_*>::set
              ((ThreadLocal<testing::Sequence_*> *)internal::g_gmock_implicit_sequence,&local_18);
    this->sequence_created_ = true;
  }
  else {
    this->sequence_created_ = false;
  }
  return;
}

Assistant:

InSequence::InSequence() {
  if (internal::g_gmock_implicit_sequence.get() == NULL) {
    internal::g_gmock_implicit_sequence.set(new Sequence);
    sequence_created_ = true;
  } else {
    sequence_created_ = false;
  }
}